

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_request.cpp
# Opt level: O3

void __thiscall Request_Partial_Test::~Request_Partial_Test(Request_Partial_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (Request, Partial) {
    refiller r;
    EXPECT_CALL (r, fill (_, _)).WillRepeatedly (Invoke (eof ()));
    EXPECT_CALL (r, fill (0, _)).WillOnce (Invoke (yield_string ("METHOD")));

    auto io = 0;
    auto br = make_buffered_reader<int> (r.refill_function ());
    error_or_n<int, request_info> const res = read_request (br, io);
    ASSERT_FALSE (static_cast<bool> (res));
}